

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biptlist.cpp
# Opt level: O3

vector<Pt2i,_std::allocator<Pt2i>_> * __thiscall BiPtList::backPoints(BiPtList *this)

{
  _Elt_pointer pPVar1;
  vector<Pt2i,_std::allocator<Pt2i>_> *this_00;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  value_type *__x;
  value_type *pvVar6;
  value_type *pvVar7;
  _Map_pointer ppPVar8;
  
  this_00 = (vector<Pt2i,_std::allocator<Pt2i>_> *)operator_new(0x18);
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pPVar1 = (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.super__Deque_impl_data
           ._M_start._M_cur;
  ppPVar8 = (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  lVar5 = (long)this->start + 1;
  uVar2 = ((long)pPVar1 -
           (long)(this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) + lVar5;
  if ((long)uVar2 < 0) {
    uVar3 = (long)uVar2 >> 6;
  }
  else {
    if (uVar2 < 0x40) {
      pvVar6 = (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      __x = pPVar1 + lVar5;
      goto LAB_0012eaa2;
    }
    uVar3 = uVar2 >> 6;
  }
  ppPVar8 = ppPVar8 + uVar3;
  __x = *ppPVar8 + uVar2 + uVar3 * -0x40;
  pvVar6 = *ppPVar8 + 0x40;
LAB_0012eaa2:
  if (this->start - this->cpt < -1) {
    iVar4 = 0;
    do {
      pvVar7 = __x + 1;
      if (pvVar7 == pvVar6) {
        pvVar7 = ppPVar8[1];
        ppPVar8 = ppPVar8 + 1;
        pvVar6 = pvVar7 + 0x40;
      }
      std::vector<Pt2i,_std::allocator<Pt2i>_>::push_back(this_00,__x);
      iVar4 = iVar4 + 1;
      __x = pvVar7;
    } while (iVar4 < ~this->start + this->cpt);
  }
  return this_00;
}

Assistant:

std::vector<Pt2i> *BiPtList::backPoints () const
{
  std::vector<Pt2i> *res = new std::vector<Pt2i> ();
  std::deque<Pt2i>::const_iterator it = pts.begin ();
  it += start + 1;
  for (int i = 0; i < cpt - start - 1; i++) res->push_back (*it++);
  return res;
}